

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_SETEND(DisasContext_conflict1 *s,arg_SETEND *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGContext_conflict1 *tcg_ctx;
  arg_SETEND *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = arm_dc_feature(s,3);
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else {
    if (a->E != (uint)(s->be_data == MO_BE)) {
      gen_helper_setend(tcg_ctx_00,tcg_ctx_00->cpu_env);
      (s->base).is_jmp = DISAS_TARGET_1;
    }
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_SETEND(DisasContext *s, arg_SETEND *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!ENABLE_ARCH_6) {
        return false;
    }
    if (a->E != (s->be_data == MO_BE)) {
        gen_helper_setend(tcg_ctx, tcg_ctx->cpu_env);
        s->base.is_jmp = DISAS_UPDATE;
    }
    return true;
}